

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

char * nullcDebugGetInstructionSourceLocation(uint instruction)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  
  if (NULLC::linker == 0) {
    uVar4 = 0;
    puVar5 = (uint *)0x0;
  }
  else {
    uVar4 = *(uint *)(NULLC::linker + 0x2ec);
    puVar5 = *(uint **)(NULLC::linker + 0x2e0);
  }
  if (uVar4 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    if (NULLC::linker == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = *(long *)(NULLC::linker + 0x2a0);
    }
    bVar8 = true;
    uVar3 = 1;
    puVar2 = puVar5;
    do {
      if ((*puVar2 == instruction) || ((uVar3 < uVar4 && (instruction < puVar2[3])))) {
        pcVar7 = (char *)((ulong)puVar2[2] + lVar6);
        break;
      }
      bVar8 = uVar3 < uVar4;
      iVar1 = (-(uint)(uVar4 == 0) - uVar4) + uVar3;
      uVar3 = uVar3 + 1;
      pcVar7 = (char *)(ulong)uVar3;
      puVar2 = puVar2 + 3;
    } while (iVar1 != 0);
    if (!bVar8) {
      pcVar7 = (char *)(lVar6 + (ulong)puVar5[(ulong)(uVar4 - 1) * 3 + 2]);
    }
  }
  return pcVar7;
}

Assistant:

const char* nullcDebugGetInstructionSourceLocation(unsigned instruction)
{
	unsigned infoSize = 0;
	ExternSourceInfo *sourceInfo = nullcDebugSourceInfo(&infoSize);

	if(!infoSize)
		return NULL;

	const char *fullSource = nullcDebugSource();

	for(unsigned i = 0; i < infoSize; i++)
	{
		if(instruction == sourceInfo[i].instruction)
			return fullSource + sourceInfo[i].sourceOffset;

		if(i + 1 < infoSize && instruction < sourceInfo[i + 1].instruction)
			return fullSource + sourceInfo[i].sourceOffset;
	}

	return fullSource + sourceInfo[infoSize - 1].sourceOffset;
}